

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy.c
# Opt level: O3

int mbedtls_entropy_write_seed_file(mbedtls_entropy_context *ctx,char *path)

{
  int iVar1;
  FILE *__s;
  size_t sVar2;
  long lVar3;
  uchar buf [64];
  uchar local_58 [64];
  
  __s = fopen(path,"wb");
  if (__s == (FILE *)0x0) {
    iVar1 = -0x3f;
  }
  else {
    iVar1 = mbedtls_entropy_func(ctx,local_58,0x40);
    if (iVar1 == 0) {
      sVar2 = fwrite(local_58,1,0x40,__s);
      iVar1 = -0x3f;
      if (sVar2 == 0x40) {
        iVar1 = 0;
      }
    }
    lVar3 = 0;
    do {
      local_58[lVar3] = '\0';
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x40);
    fclose(__s);
  }
  return iVar1;
}

Assistant:

int mbedtls_entropy_write_seed_file( mbedtls_entropy_context *ctx, const char *path )
{
    int ret = MBEDTLS_ERR_ENTROPY_FILE_IO_ERROR;
    FILE *f;
    unsigned char buf[MBEDTLS_ENTROPY_BLOCK_SIZE];

    if( ( f = fopen( path, "wb" ) ) == NULL )
        return( MBEDTLS_ERR_ENTROPY_FILE_IO_ERROR );

    if( ( ret = mbedtls_entropy_func( ctx, buf, MBEDTLS_ENTROPY_BLOCK_SIZE ) ) != 0 )
        goto exit;

    if( fwrite( buf, 1, MBEDTLS_ENTROPY_BLOCK_SIZE, f ) != MBEDTLS_ENTROPY_BLOCK_SIZE )
    {
        ret = MBEDTLS_ERR_ENTROPY_FILE_IO_ERROR;
        goto exit;
    }

    ret = 0;

exit:
    mbedtls_zeroize( buf, sizeof( buf ) );

    fclose( f );
    return( ret );
}